

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rules.cpp
# Opt level: O0

ShaderReplacementRule *
polyscope::render::backend_openGL3_glfw::generateSlicePlaneRule(string *uniquePostfix)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<polyscope::render::ShaderSpecUniform> __l_00;
  ShaderReplacementRule *in_RDI;
  string normalUniformName;
  string centerUniformName;
  ShaderReplacementRule *slicePlaneRule;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  *in_stack_fffffffffffffc00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  allocator_type *in_stack_fffffffffffffc18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc20;
  iterator in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  *in_stack_fffffffffffffc38;
  undefined1 ***pppuVar1;
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  *in_stack_fffffffffffffc40;
  undefined1 ***pppuVar2;
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  *in_stack_fffffffffffffc48;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc50;
  string *psVar3;
  string *in_stack_fffffffffffffc58;
  string *psVar4;
  ShaderReplacementRule *in_stack_fffffffffffffc60;
  string local_2f0 [32];
  undefined4 local_2d0;
  string local_2c8 [32];
  undefined4 local_2a8;
  string *local_2a0;
  undefined8 local_298;
  undefined1 local_271;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  undefined1 **local_130;
  undefined8 *local_128 [8];
  undefined1 local_e8 [64];
  undefined1 **local_a8;
  undefined8 local_a0;
  string local_80 [35];
  undefined1 local_5d;
  string local_50 [32];
  string local_30 [48];
  
  std::operator+((char *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  std::operator+((char *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  local_5d = 0;
  std::operator+((char *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  local_271 = 1;
  local_130 = (undefined1 **)local_128;
  std::operator+((char *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
  std::operator+(in_stack_fffffffffffffbf8,&in_stack_fffffffffffffbf0->first);
  std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[18],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffc20,(char (*) [18])in_stack_fffffffffffffc18,
             in_stack_fffffffffffffc10);
  local_130 = (undefined1 **)local_e8;
  std::operator+((char *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
  std::operator+(in_stack_fffffffffffffbf8,&in_stack_fffffffffffffbf0->first);
  std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
  std::operator+(in_stack_fffffffffffffbf8,&in_stack_fffffffffffffbf0->first);
  std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[23],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffc20,(char (*) [23])in_stack_fffffffffffffc18,
             in_stack_fffffffffffffc10);
  local_271 = 0;
  local_a8 = (undefined1 **)local_128;
  local_a0 = 2;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x4120d1);
  __l._M_len = (size_type)in_stack_fffffffffffffc30;
  __l._M_array = in_stack_fffffffffffffc28;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffffc20,__l,(allocator_type *)in_stack_fffffffffffffc18);
  std::__cxx11::string::string(local_2f0,local_30);
  local_2d0 = 1;
  std::__cxx11::string::string(local_2c8,local_50);
  local_2a8 = 1;
  local_2a0 = local_2f0;
  local_298 = 2;
  std::allocator<polyscope::render::ShaderSpecUniform>::allocator
            ((allocator<polyscope::render::ShaderSpecUniform> *)0x412189);
  __l_00._M_len = (size_type)in_stack_fffffffffffffc30;
  __l_00._M_array = (iterator)in_stack_fffffffffffffc28;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)in_stack_fffffffffffffc20,__l_00,in_stack_fffffffffffffc18);
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)0x4121e7);
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)0x41221a);
  ShaderReplacementRule::ShaderReplacementRule
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)in_stack_fffffffffffffc00);
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector(in_stack_fffffffffffffc00);
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
             *)in_stack_fffffffffffffc00);
  std::allocator<polyscope::render::ShaderSpecUniform>::~allocator
            ((allocator<polyscope::render::ShaderSpecUniform> *)0x412285);
  psVar4 = local_2f0;
  psVar3 = (string *)&local_2a0;
  do {
    psVar3 = psVar3 + -0x28;
    ShaderSpecUniform::~ShaderSpecUniform((ShaderSpecUniform *)0x4122ae);
  } while (psVar3 != psVar4);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffffc00);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x4122dc);
  pppuVar2 = (undefined1 ***)local_128;
  pppuVar1 = &local_a8;
  do {
    pppuVar1 = pppuVar1 + -8;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(in_stack_fffffffffffffbf0);
  } while (pppuVar1 != pppuVar2);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_80);
  local_5d = 1;
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

ShaderReplacementRule generateSlicePlaneRule(std::string uniquePostfix) {

  std::string centerUniformName = "u_slicePlaneCenter_" + uniquePostfix;
  std::string normalUniformName = "u_slicePlaneNormal_" + uniquePostfix;

  // This takes what is otherwise a simple rule, and substitues uniquely named uniforms so that we can have multiple slice planes
  ShaderReplacementRule slicePlaneRule (
      /* rule name */ "SLICE_PLANE_CULL_" + uniquePostfix,
      { /* replacement sources */
        {"FRAG_DECLARATIONS", "uniform vec3 " + centerUniformName + "; uniform vec3 " + normalUniformName + ";"},
        {"GLOBAL_FRAGMENT_FILTER", 
         "if(dot(cullPos, " + normalUniformName + ") < dot( " + centerUniformName + " , " + normalUniformName + ")) { discard; }"}
      },
      /* uniforms */ {
        {centerUniformName, DataType::Vector3Float},
        {normalUniformName, DataType::Vector3Float},
      },
      /* attributes */ {},
      /* textures */ {}
  );

  return slicePlaneRule;
}